

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O1

void __thiscall
rr::TriangleRasterizer::rasterizeMultiSample<2>
          (TriangleRasterizer *this,FragmentPacket *fragmentPackets,float *depthValues,
          int maxFragmentPackets,int *numPacketsRasterized)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int i_12;
  int iVar10;
  int iVar11;
  long lVar12;
  byte bVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long *plVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  long *plVar24;
  float *pfVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  bool bVar36;
  float fVar37;
  float fVar38;
  Vector<float,_4> res_1;
  Vector<float,_4> res;
  Vec4 bSum;
  Vector<float,_4> res_14;
  deInt64 sy [4];
  deInt64 sx [4];
  Vector<long,_4> e20 [2];
  Vector<long,_4> e12 [2];
  Vector<long,_4> e01 [2];
  float local_278 [4];
  undefined8 local_268;
  undefined8 uStack_260;
  float local_238 [12];
  float local_208 [20];
  float local_1b8 [28];
  float local_148 [4];
  long local_138 [4];
  long local_118 [19];
  Vec4 z0;
  Vector<float,_4> res_10;
  long alStack_60 [4];
  Vec4 z1;
  Vec4 edgeSum;
  Vector<float,_4> res_2;
  
  iVar3 = (this->m_curPos).m_data[1];
  iVar29 = 0;
  if (0 < maxFragmentPackets && iVar3 <= (this->m_bboxMax).m_data[1]) {
    fVar1 = (this->m_v2).m_data[2];
    fVar37 = (this->m_v0).m_data[2] - fVar1;
    fVar38 = (this->m_v1).m_data[2] - fVar1;
    iVar29 = 0;
    do {
      iVar4 = (this->m_curPos).m_data[0];
      iVar14 = iVar4 + 1;
      iVar20 = iVar3 + 1;
      local_118[0] = (long)(iVar4 << 8);
      local_118[1] = (long)(iVar14 * 0x100);
      local_118[2] = (long)(iVar4 << 8);
      local_118[3] = (long)(iVar14 * 0x100);
      local_138[0] = (long)(iVar3 << 8);
      local_138[1] = (long)(iVar3 << 8);
      local_138[2] = (long)(iVar20 * 0x100);
      local_138[3] = (long)(iVar20 * 0x100);
      iVar10 = (this->m_viewport).m_data[3] + (this->m_viewport).m_data[1];
      iVar11 = (this->m_viewport).m_data[2] + (this->m_viewport).m_data[0];
      z0.m_data[2] = 0.0;
      z0.m_data[3] = 0.0;
      local_118[0x12] = 0;
      z0.m_data[0] = 0.0;
      z0.m_data[1] = 0.0;
      local_118[0x10] = 0;
      local_118[0x11] = 0;
      local_118[0xe] = 0;
      local_118[0xf] = 0;
      local_118[0xc] = 0;
      local_118[0xd] = 0;
      local_118[10] = 0;
      local_118[0xb] = 0;
      local_118[8] = 0;
      local_118[9] = 0;
      local_118[6] = 0;
      local_118[7] = 0;
      local_118[4] = 0;
      local_118[5] = 0;
      lVar23 = (this->m_edge01).a;
      lVar28 = (this->m_edge01).b;
      lVar30 = (this->m_edge01).c;
      lVar33 = (this->m_edge12).a;
      lVar5 = (this->m_edge12).b;
      lVar6 = (this->m_edge12).c;
      lVar7 = (this->m_edge20).a;
      lVar8 = (this->m_edge20).b;
      lVar9 = (this->m_edge20).c;
      pfVar25 = z0.m_data + 2;
      plVar24 = local_118 + 0xc;
      plVar18 = local_118;
      lVar34 = 0;
      do {
        plVar18 = plVar18 + 4;
        lVar31 = (&s_samplePos2)[lVar34 * 2];
        lVar35 = (&DAT_0037aea8)[lVar34 * 2];
        lVar26 = 0;
        do {
          lVar12 = local_118[lVar26] + lVar31;
          lVar21 = local_138[lVar26] + lVar35;
          *(long *)(pfVar25 + lVar26 * 2) = lVar28 * lVar21 + lVar23 * lVar12 + lVar30;
          plVar24[lVar26] = lVar5 * lVar21 + lVar33 * lVar12 + lVar6;
          plVar18[lVar26] = lVar21 * lVar8 + lVar12 * lVar7 + lVar9;
          lVar26 = lVar26 + 1;
        } while (lVar26 != 4);
        plVar24 = plVar24 + 4;
        pfVar25 = pfVar25 + 8;
        bVar36 = lVar34 == 0;
        lVar34 = lVar34 + 1;
      } while (bVar36);
      uVar27 = (ulong)(this->m_edge01).inclusive;
      lVar28 = -uVar27;
      uVar22 = (ulong)(this->m_edge12).inclusive;
      lVar23 = -uVar22;
      uVar32 = (ulong)(this->m_edge20).inclusive;
      lVar33 = -uVar32;
      lVar30 = 0x18;
      uVar15 = 0;
      uVar17 = 0;
      do {
        lVar5 = *(long *)((long)local_118 + lVar30 + 0x88);
        if ((lVar5 == lVar28 || SBORROW8(lVar5,lVar28) != (long)(lVar5 + uVar27) < 0) ||
           (lVar5 = *(long *)((long)local_118 + lVar30 + 0x48),
           lVar5 == lVar23 || SBORROW8(lVar5,lVar23) != (long)(lVar5 + uVar22) < 0)) {
          bVar36 = false;
        }
        else {
          lVar5 = *(long *)((long)local_118 + lVar30 + 8);
          bVar36 = lVar5 != lVar33 && SBORROW8(lVar5,lVar33) == (long)(lVar5 + uVar32) < 0;
        }
        uVar19 = uVar17 & ~(1L << (uVar15 & 0x3f));
        if (bVar36) {
          uVar19 = uVar17 | 1L << (uVar15 & 0x3f);
        }
        if (((iVar14 == iVar11) ||
            (lVar5 = *(long *)((long)z0.m_data + lVar30 + -8),
            lVar5 == lVar28 || SBORROW8(lVar5,lVar28) != (long)(lVar5 + uVar27) < 0)) ||
           (lVar5 = *(long *)((long)local_118 + lVar30 + 0x50),
           lVar5 == lVar23 || SBORROW8(lVar5,lVar23) != (long)(lVar5 + uVar22) < 0)) {
          bVar36 = false;
        }
        else {
          lVar5 = *(long *)((long)local_118 + lVar30 + 0x10);
          bVar36 = lVar5 != lVar33 && SBORROW8(lVar5,lVar33) == (long)(lVar5 + uVar32) < 0;
        }
        bVar13 = (byte)uVar15;
        uVar16 = 0x10L << (bVar13 & 0x3f);
        uVar17 = ~uVar16 & uVar19;
        if (bVar36) {
          uVar17 = uVar19 | uVar16;
        }
        if (((iVar20 == iVar10) ||
            (lVar5 = *(long *)((long)z0.m_data + lVar30),
            lVar5 == lVar28 || SBORROW8(lVar5,lVar28) != (long)(lVar5 + uVar27) < 0)) ||
           (lVar5 = *(long *)((long)local_118 + lVar30 + 0x58),
           lVar5 == lVar23 || SBORROW8(lVar5,lVar23) != (long)(lVar5 + uVar22) < 0)) {
          bVar36 = false;
        }
        else {
          lVar5 = *(long *)((long)local_118 + lVar30 + 0x18);
          bVar36 = lVar5 != lVar33 && SBORROW8(lVar5,lVar33) == (long)(lVar5 + uVar32) < 0;
        }
        uVar16 = 4L << (bVar13 & 0x3f);
        uVar19 = ~uVar16 & uVar17;
        if (bVar36) {
          uVar19 = uVar17 | uVar16;
        }
        if (((iVar20 == iVar10 || iVar14 == iVar11) ||
            (lVar5 = *(long *)((long)z0.m_data + lVar30 + 8),
            lVar5 == lVar28 || SBORROW8(lVar5,lVar28) != (long)(lVar5 + uVar27) < 0)) ||
           (lVar5 = *(long *)((long)local_118 + lVar30 + 0x60),
           lVar5 == lVar23 || SBORROW8(lVar5,lVar23) != (long)(lVar5 + uVar22) < 0)) {
          bVar36 = false;
        }
        else {
          lVar5 = *(long *)((long)local_118 + lVar30 + 0x20);
          bVar36 = lVar5 != lVar33 && SBORROW8(lVar5,lVar33) == (long)(lVar5 + uVar32) < 0;
        }
        uVar16 = 0x40L << (bVar13 & 0x3f);
        uVar17 = ~uVar16 & uVar19;
        if (bVar36) {
          uVar17 = uVar19 | uVar16;
        }
        uVar15 = uVar15 + 1;
        lVar30 = lVar30 + 0x20;
      } while (uVar15 == 1);
      (this->m_curPos).m_data[0] = iVar4 + 2;
      if ((this->m_bboxMax).m_data[0] < iVar4 + 2) {
        (this->m_curPos).m_data[1] = iVar3 + 2;
        (this->m_curPos).m_data[0] = (this->m_bboxMin).m_data[0];
      }
      if (uVar17 != 0) {
        if (depthValues != (float *)0x0) {
          plVar18 = local_118;
          plVar24 = local_118 + 0xc;
          pfVar25 = z0.m_data + 2;
          lVar23 = 0;
          do {
            plVar18 = plVar18 + 4;
            local_208[8] = 0.0;
            local_208[9] = 0.0;
            local_208[10] = 0.0;
            local_208[0xb] = 0.0;
            lVar28 = 0;
            do {
              local_208[lVar28 + 8] = (float)*(long *)(pfVar25 + lVar28 * 2);
              lVar28 = lVar28 + 1;
            } while (lVar28 != 4);
            local_208[4] = 0.0;
            local_208[5] = 0.0;
            local_208[6] = 0.0;
            local_208[7] = 0.0;
            lVar28 = 0;
            do {
              local_208[lVar28 + 4] = (float)plVar24[lVar28];
              lVar28 = lVar28 + 1;
            } while (lVar28 != 4);
            local_208[0] = 0.0;
            local_208[1] = 0.0;
            local_208[2] = 0.0;
            local_208[3] = 0.0;
            lVar28 = 0;
            do {
              local_208[lVar28] = (float)plVar18[lVar28];
              lVar28 = lVar28 + 1;
            } while (lVar28 != 4);
            local_278[0] = 0.0;
            local_278[1] = 0.0;
            local_278[2] = 0.0;
            local_278[3] = 0.0;
            lVar28 = 0;
            do {
              local_278[lVar28] = local_208[lVar28 + 8] + local_208[lVar28 + 4];
              lVar28 = lVar28 + 1;
            } while (lVar28 != 4);
            local_238[4] = 0.0;
            local_238[5] = 0.0;
            local_238[6] = 0.0;
            local_238[7] = 0.0;
            lVar28 = 0;
            do {
              local_238[lVar28 + 4] = local_278[lVar28] + local_208[lVar28];
              lVar28 = lVar28 + 1;
            } while (lVar28 != 4);
            local_278[0] = 0.0;
            local_278[1] = 0.0;
            local_278[2] = 0.0;
            local_278[3] = 0.0;
            lVar28 = 0;
            do {
              local_278[lVar28] = local_208[lVar28 + 4] / local_238[lVar28 + 4];
              lVar28 = lVar28 + 1;
            } while (lVar28 != 4);
            local_238[0] = 0.0;
            local_238[1] = 0.0;
            local_238[2] = 0.0;
            local_238[3] = 0.0;
            lVar28 = 0;
            do {
              local_238[lVar28] = local_208[lVar28] / local_238[lVar28 + 4];
              lVar28 = lVar28 + 1;
            } while (lVar28 != 4);
            lVar28 = lVar23 + iVar29 * 8;
            depthValues[lVar28] = local_278[0] * fVar37 + local_238[0] * fVar38 + fVar1;
            depthValues[lVar28 + 2] = local_278[1] * fVar37 + local_238[1] * fVar38 + fVar1;
            depthValues[lVar28 + 4] = local_278[2] * fVar37 + local_238[2] * fVar38 + fVar1;
            depthValues[lVar28 + 6] = local_278[3] * fVar37 + local_238[3] * fVar38 + fVar1;
            pfVar25 = pfVar25 + 8;
            plVar24 = plVar24 + 4;
            bVar36 = lVar23 == 0;
            lVar23 = lVar23 + 1;
          } while (bVar36);
        }
        local_208[8] = 0.0;
        local_208[9] = 0.0;
        local_208[10] = 0.0;
        local_208[0xb] = 0.0;
        local_208[4] = 0.0;
        local_208[5] = 0.0;
        local_208[6] = 0.0;
        local_208[7] = 0.0;
        local_208[0] = 0.0;
        local_208[1] = 0.0;
        local_208[2] = 0.0;
        local_208[3] = 0.0;
        lVar23 = (this->m_edge01).a;
        lVar28 = (this->m_edge01).b;
        lVar30 = (this->m_edge01).c;
        lVar33 = (this->m_edge12).a;
        lVar5 = (this->m_edge12).b;
        lVar6 = (this->m_edge12).c;
        lVar7 = (this->m_edge20).a;
        lVar8 = (this->m_edge20).b;
        lVar9 = (this->m_edge20).c;
        lVar34 = 0;
        do {
          lVar35 = *(long *)((long)local_118 + lVar34 * 2) + 0x80;
          lVar31 = *(long *)((long)local_138 + lVar34 * 2) + 0x80;
          *(float *)((long)local_208 + lVar34 + 0x20) =
               (float)(lVar28 * lVar31 + lVar23 * lVar35 + lVar30);
          *(float *)((long)local_208 + lVar34 + 0x10) =
               (float)(lVar5 * lVar31 + lVar33 * lVar35 + lVar6);
          *(float *)((long)local_208 + lVar34) = (float)(lVar31 * lVar8 + lVar35 * lVar7 + lVar9);
          lVar34 = lVar34 + 4;
        } while (lVar34 != 0x10);
        fVar2 = (this->m_v0).m_data[3];
        local_238[4] = 0.0;
        local_238[5] = 0.0;
        local_238[6] = 0.0;
        local_238[7] = 0.0;
        lVar23 = 0;
        do {
          local_238[lVar23 + 4] = local_208[lVar23 + 4] * fVar2;
          lVar23 = lVar23 + 1;
        } while (lVar23 != 4);
        fVar2 = (this->m_v1).m_data[3];
        local_278[0] = 0.0;
        local_278[1] = 0.0;
        local_278[2] = 0.0;
        local_278[3] = 0.0;
        lVar23 = 0;
        do {
          local_278[lVar23] = local_208[lVar23] * fVar2;
          lVar23 = lVar23 + 1;
        } while (lVar23 != 4);
        fVar2 = (this->m_v2).m_data[3];
        local_238[0] = 0.0;
        local_238[1] = 0.0;
        local_238[2] = 0.0;
        local_238[3] = 0.0;
        lVar23 = 0;
        do {
          local_238[lVar23] = local_208[lVar23 + 8] * fVar2;
          lVar23 = lVar23 + 1;
        } while (lVar23 != 4);
        local_268 = 0;
        uStack_260 = 0;
        lVar23 = 0;
        do {
          *(float *)((long)&local_268 + lVar23 * 4) = local_238[lVar23 + 4] + local_278[lVar23];
          lVar23 = lVar23 + 1;
        } while (lVar23 != 4);
        local_1b8[0] = 0.0;
        local_1b8[1] = 0.0;
        local_1b8[2] = 0.0;
        local_1b8[3] = 0.0;
        lVar23 = 0;
        do {
          local_1b8[lVar23] = *(float *)((long)&local_268 + lVar23 * 4) + local_238[lVar23];
          lVar23 = lVar23 + 1;
        } while (lVar23 != 4);
        *(ulong *)fragmentPackets[iVar29].position.m_data = CONCAT44(iVar3,iVar4);
        fragmentPackets[iVar29].coverage = uVar17;
        local_268 = 0;
        uStack_260 = 0;
        lVar23 = 0;
        do {
          *(float *)((long)&local_268 + lVar23 * 4) = local_238[lVar23 + 4] / local_1b8[lVar23];
          lVar23 = lVar23 + 1;
        } while (lVar23 != 4);
        *(undefined8 *)fragmentPackets[iVar29].barycentric[0].m_data = local_268;
        *(undefined8 *)(fragmentPackets[iVar29].barycentric[0].m_data + 2) = uStack_260;
        local_268 = 0;
        uStack_260 = 0;
        lVar23 = 0;
        do {
          *(float *)((long)&local_268 + lVar23 * 4) = local_278[lVar23] / local_1b8[lVar23];
          lVar23 = lVar23 + 1;
        } while (lVar23 != 4);
        *(undefined8 *)fragmentPackets[iVar29].barycentric[1].m_data = local_268;
        *(undefined8 *)(fragmentPackets[iVar29].barycentric[1].m_data + 2) = uStack_260;
        local_148[0] = 0.0;
        local_148[1] = 0.0;
        local_148[2] = 0.0;
        local_148[3] = 0.0;
        lVar23 = 0;
        do {
          local_148[lVar23] = 1.0 - fragmentPackets[iVar29].barycentric[0].m_data[lVar23];
          lVar23 = lVar23 + 1;
        } while (lVar23 != 4);
        local_268 = 0;
        uStack_260 = 0;
        lVar23 = 0;
        do {
          *(float *)((long)&local_268 + lVar23 * 4) =
               local_148[lVar23] - fragmentPackets[iVar29].barycentric[1].m_data[lVar23];
          lVar23 = lVar23 + 1;
        } while (lVar23 != 4);
        *(undefined8 *)fragmentPackets[iVar29].barycentric[2].m_data = local_268;
        *(undefined8 *)(fragmentPackets[iVar29].barycentric[2].m_data + 2) = uStack_260;
        iVar29 = iVar29 + 1;
      }
      iVar3 = (this->m_curPos).m_data[1];
    } while ((iVar3 <= (this->m_bboxMax).m_data[1]) && (iVar29 < maxFragmentPackets));
  }
  *numPacketsRasterized = iVar29;
  return;
}

Assistant:

void TriangleRasterizer::rasterizeMultiSample (FragmentPacket* const fragmentPackets, float* const depthValues, const int maxFragmentPackets, int& numPacketsRasterized)
{
	DE_ASSERT(maxFragmentPackets > 0);

	const deInt64*	samplePos	= DE_NULL;
	const deUint64	halfPixel	= 1ll << (RASTERIZER_SUBPIXEL_BITS-1);
	int				packetNdx	= 0;

	// For depth interpolation, see rasterizeSingleSample
	const float		za			= m_v0.z()-m_v2.z();
	const float		zb			= m_v1.z()-m_v2.z();
	const float		zc			= m_v2.z();

	switch (NumSamples)
	{
		case 2:		samplePos = s_samplePos2;	break;
		case 4:		samplePos = s_samplePos4;	break;
		case 8:		samplePos = s_samplePos8;	break;
		case 16:	samplePos = s_samplePos16;	break;
		default:
			DE_ASSERT(false);
	}

	while (m_curPos.y() <= m_bboxMax.y() && packetNdx < maxFragmentPackets)
	{
		const int		x0		= m_curPos.x();
		const int		y0		= m_curPos.y();

		// Base subpixel coords
		const deInt64	sx0		= toSubpixelCoord(x0);
		const deInt64	sx1		= toSubpixelCoord(x0+1);
		const deInt64	sy0		= toSubpixelCoord(y0);
		const deInt64	sy1		= toSubpixelCoord(y0+1);

		const deInt64	sx[4]	= { sx0, sx1, sx0, sx1 };
		const deInt64	sy[4]	= { sy0, sy0, sy1, sy1 };

		// Viewport test
		const bool		outX1	= x0+1 == m_viewport.x()+m_viewport.z();
		const bool		outY1	= y0+1 == m_viewport.y()+m_viewport.w();

		DE_ASSERT(x0 < m_viewport.x()+m_viewport.z());
		DE_ASSERT(y0 < m_viewport.y()+m_viewport.w());

		// Edge values
		tcu::Vector<deInt64, 4>	e01[NumSamples];
		tcu::Vector<deInt64, 4>	e12[NumSamples];
		tcu::Vector<deInt64, 4>	e20[NumSamples];

		// Coverage
		deUint64		coverage	= 0;

		// Evaluate edge values at sample positions
		for (int sampleNdx = 0; sampleNdx < NumSamples; sampleNdx++)
		{
			const deInt64 ox = samplePos[sampleNdx*2 + 0];
			const deInt64 oy = samplePos[sampleNdx*2 + 1];

			for (int fragNdx = 0; fragNdx < 4; fragNdx++)
			{
				e01[sampleNdx][fragNdx] = evaluateEdge(m_edge01, sx[fragNdx] + ox, sy[fragNdx] + oy);
				e12[sampleNdx][fragNdx] = evaluateEdge(m_edge12, sx[fragNdx] + ox, sy[fragNdx] + oy);
				e20[sampleNdx][fragNdx] = evaluateEdge(m_edge20, sx[fragNdx] + ox, sy[fragNdx] + oy);
			}
		}

		// Compute coverage mask
		for (int sampleNdx = 0; sampleNdx < NumSamples; sampleNdx++)
		{
			coverage = setCoverageValue(coverage, NumSamples, 0, 0, sampleNdx,						isInsideCCW(m_edge01, e01[sampleNdx][0]) && isInsideCCW(m_edge12, e12[sampleNdx][0]) && isInsideCCW(m_edge20, e20[sampleNdx][0]));
			coverage = setCoverageValue(coverage, NumSamples, 1, 0, sampleNdx, !outX1 &&			isInsideCCW(m_edge01, e01[sampleNdx][1]) && isInsideCCW(m_edge12, e12[sampleNdx][1]) && isInsideCCW(m_edge20, e20[sampleNdx][1]));
			coverage = setCoverageValue(coverage, NumSamples, 0, 1, sampleNdx, !outY1 &&			isInsideCCW(m_edge01, e01[sampleNdx][2]) && isInsideCCW(m_edge12, e12[sampleNdx][2]) && isInsideCCW(m_edge20, e20[sampleNdx][2]));
			coverage = setCoverageValue(coverage, NumSamples, 1, 1, sampleNdx, !outX1 && !outY1 &&	isInsideCCW(m_edge01, e01[sampleNdx][3]) && isInsideCCW(m_edge12, e12[sampleNdx][3]) && isInsideCCW(m_edge20, e20[sampleNdx][3]));
		}

		// Advance to next location
		m_curPos.x() += 2;
		if (m_curPos.x() > m_bboxMax.x())
		{
			m_curPos.y() += 2;
			m_curPos.x()  = m_bboxMin.x();
		}

		if (coverage == 0)
			continue; // Discard.

		// Compute depth values.
		if (depthValues)
		{
			for (int sampleNdx = 0; sampleNdx < NumSamples; sampleNdx++)
			{
				// Floating-point edge values at sample coordinates.
				const tcu::Vec4&	e01f	= e01[sampleNdx].asFloat();
				const tcu::Vec4&	e12f	= e12[sampleNdx].asFloat();
				const tcu::Vec4&	e20f	= e20[sampleNdx].asFloat();

				const tcu::Vec4		edgeSum	= e01f + e12f + e20f;
				const tcu::Vec4		z0		= e12f / edgeSum;
				const tcu::Vec4		z1		= e20f / edgeSum;

				depthValues[(packetNdx*4+0)*NumSamples + sampleNdx] = z0[0]*za + z1[0]*zb + zc;
				depthValues[(packetNdx*4+1)*NumSamples + sampleNdx] = z0[1]*za + z1[1]*zb + zc;
				depthValues[(packetNdx*4+2)*NumSamples + sampleNdx] = z0[2]*za + z1[2]*zb + zc;
				depthValues[(packetNdx*4+3)*NumSamples + sampleNdx] = z0[3]*za + z1[3]*zb + zc;
			}
		}

		// Compute barycentrics and write out fragment packet
		{
			FragmentPacket& packet = fragmentPackets[packetNdx];

			// Floating-point edge values at pixel center.
			tcu::Vec4			e01f;
			tcu::Vec4			e12f;
			tcu::Vec4			e20f;

			for (int i = 0; i < 4; i++)
			{
				e01f[i] = float(evaluateEdge(m_edge01, sx[i] + halfPixel, sy[i] + halfPixel));
				e12f[i] = float(evaluateEdge(m_edge12, sx[i] + halfPixel, sy[i] + halfPixel));
				e20f[i] = float(evaluateEdge(m_edge20, sx[i] + halfPixel, sy[i] + halfPixel));
			}

			// Barycentrics & scale.
			const tcu::Vec4		b0		= e12f * m_v0.w();
			const tcu::Vec4		b1		= e20f * m_v1.w();
			const tcu::Vec4		b2		= e01f * m_v2.w();
			const tcu::Vec4		bSum	= b0 + b1 + b2;

			packet.position			= tcu::IVec2(x0, y0);
			packet.coverage			= coverage;
			packet.barycentric[0]	= b0 / bSum;
			packet.barycentric[1]	= b1 / bSum;
			packet.barycentric[2]	= 1.0f - packet.barycentric[0] - packet.barycentric[1];

			packetNdx += 1;
		}
	}

	DE_ASSERT(packetNdx <= maxFragmentPackets);
	numPacketsRasterized = packetNdx;
}